

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O2

void icu_63::Calendar::getCalendarTypeFromLocale
               (Locale *aLocale,char *typeBuffer,int32_t typeBufferSize,UErrorCode *success)

{
  int iVar1;
  undefined4 extraout_var;
  SharedCalendar *shared;
  SharedCalendar *local_28;
  
  local_28 = (SharedCalendar *)0x0;
  UnifiedCache::getByLocale<icu_63::SharedCalendar>(aLocale,&local_28,success);
  if (*success < U_ILLEGAL_ARGUMENT_ERROR) {
    iVar1 = (*(local_28->ptr->super_UObject)._vptr_UObject[0x17])();
    strncpy(typeBuffer,(char *)CONCAT44(extraout_var,iVar1),(long)typeBufferSize);
    SharedObject::removeRef(&local_28->super_SharedObject);
    if (typeBuffer[(long)typeBufferSize - 1] != '\0') {
      *success = U_BUFFER_OVERFLOW_ERROR;
    }
  }
  return;
}

Assistant:

void U_EXPORT2
Calendar::getCalendarTypeFromLocale(
        const Locale &aLocale,
        char *typeBuffer,
        int32_t typeBufferSize,
        UErrorCode &success) {
    const SharedCalendar *shared = NULL;
    UnifiedCache::getByLocale(aLocale, shared, success);
    if (U_FAILURE(success)) {
        return;
    }
    uprv_strncpy(typeBuffer, (*shared)->getType(), typeBufferSize);
    shared->removeRef();
    if (typeBuffer[typeBufferSize - 1]) {
        success = U_BUFFER_OVERFLOW_ERROR;
    }
}